

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-type.cpp
# Opt level: O0

FeatureSet __thiscall wasm::Type::getFeatures(Type *this)

{
  bool bVar1;
  FeatureSet local_54;
  Type *local_50;
  Type *t;
  Iterator __end2;
  Iterator __begin2;
  Type *__range2;
  Type *pTStack_18;
  anon_class_1_0_00000001 getSingleFeatures;
  Type *this_local;
  FeatureSet feats;
  
  pTStack_18 = this;
  bVar1 = isTuple(this);
  if (bVar1) {
    FeatureSet::FeatureSet((FeatureSet *)((long)&this_local + 4),0x200);
    join_0x00000010_0x00000000_ =
         (ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>)begin(this);
    _t = (ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>)end(this);
    while (bVar1 = ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>::operator!=
                             ((ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator> *)
                              &__end2.
                               super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.
                               index,(ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>
                                      *)&t), bVar1) {
      local_50 = Iterator::operator*((Iterator *)
                                     &__end2.
                                      super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>
                                      .index);
      local_54 = getFeatures::anon_class_1_0_00000001::operator()
                           ((anon_class_1_0_00000001 *)((long)&__range2 + 7),(Type)local_50->id);
      FeatureSet::operator|=((FeatureSet *)((long)&this_local + 4),&local_54);
      ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>::operator++
                ((ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator> *)
                 &__end2.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.index);
    }
  }
  else {
    this_local._4_4_ =
         getFeatures::anon_class_1_0_00000001::operator()
                   ((anon_class_1_0_00000001 *)((long)&__range2 + 7),(Type)this->id);
  }
  return (FeatureSet)this_local._4_4_;
}

Assistant:

FeatureSet Type::getFeatures() const {
  auto getSingleFeatures = [](Type t) -> FeatureSet {
    if (t.isRef()) {
      return t.getHeapType().getFeatures();
    }

    switch (t.getBasic()) {
      case Type::v128:
        return FeatureSet::SIMD;
      default:
        return FeatureSet::MVP;
    }
  };

  if (isTuple()) {
    FeatureSet feats = FeatureSet::Multivalue;
    for (const auto& t : *this) {
      feats |= getSingleFeatures(t);
    }
    return feats;
  }
  return getSingleFeatures(*this);
}